

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O1

void __thiscall
Ratio::setAllEEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  pointer pPVar1;
  PhyloTreeEdge *e;
  pointer this_00;
  double dVar2;
  double dVar3;
  
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=(&this->eEdges,edges);
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar2 = 0.0;
  for (this_00 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1)
  {
    dVar3 = PhyloTreeEdge::getLength(this_00);
    dVar2 = dVar2 + dVar3 * dVar3;
  }
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  this->eLength = dVar2;
  return;
}

Assistant:

void Ratio::setAllEEdges(vector<PhyloTreeEdge>& edges) {
    eEdges = edges;
    eLength = geoAvg(eEdges);
}